

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::Function::WhileEachInst
          (Function *this,function<bool_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts,bool run_on_non_semantic_insts)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var1;
  pointer pIVar2;
  pointer puVar3;
  Instruction *pIVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  Instruction *dbg_line;
  pointer pIVar8;
  pointer puVar9;
  Instruction *dbg_line_4;
  Instruction *pIVar10;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *non_semantic;
  Function *pFVar11;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *param;
  pointer puVar12;
  Instruction *pIVar13;
  Instruction *dbg_line_1;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_58;
  undefined4 local_4c;
  Function *local_48;
  undefined4 local_3c;
  pointer local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,run_on_non_semantic_insts);
  local_4c = (undefined4)CONCAT71(in_register_00000011,run_on_debug_line_insts);
  _Var1._M_head_impl =
       (this->def_inst_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_48 = this;
  if (_Var1._M_head_impl != (Instruction *)0x0) {
    if (run_on_debug_line_insts) {
      pIVar13 = *(pointer *)((long)&(_Var1._M_head_impl)->dbg_line_insts_ + 8);
      for (pIVar10 = *(Instruction **)
                      &((_Var1._M_head_impl)->dbg_line_insts_).
                       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                       ._M_impl; pIVar10 != pIVar13; pIVar10 = pIVar10 + 1) {
        local_58._M_head_impl = pIVar10;
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021610f;
        bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
        if (!bVar6) {
          return false;
        }
      }
    }
    local_58._M_head_impl = _Var1._M_head_impl;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021610f;
    bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
    if (!bVar6) {
      return false;
    }
  }
  puVar12 = (local_48->params_).
            super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (local_48->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != local_38) {
    do {
      pIVar10 = (puVar12->_M_t).
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if ((char)local_4c != '\0') {
        pIVar2 = *(pointer *)
                  ((long)&(pIVar10->dbg_line_insts_).
                          super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  + 8);
        for (pIVar8 = (pIVar10->dbg_line_insts_).
                      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                      ._M_impl.super__Vector_impl_data._M_start; pIVar8 != pIVar2;
            pIVar8 = pIVar8 + 1) {
          local_58._M_head_impl = pIVar8;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021610f;
          bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
          if (!bVar6) {
            return false;
          }
        }
      }
      local_58._M_head_impl = pIVar10;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021610f;
      bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
      if (!bVar6) {
        return false;
      }
      puVar12 = puVar12 + 1;
    } while (puVar12 != local_38);
  }
  pIVar10 = (local_48->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar10 == (Instruction *)0x0) ||
     ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
LAB_00215fc1:
    puVar9 = (local_48->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (local_48->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar9 != puVar3) {
      bVar6 = (bool)(char)local_4c;
      do {
        bVar7 = BasicBlock::WhileEachInst
                          ((puVar9->_M_t).
                           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,f
                           ,bVar6);
        if (!bVar7) {
          return false;
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar3);
    }
    pIVar10 = (local_48->end_inst_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar10 == (Instruction *)0x0) {
      bVar6 = true;
      bVar5 = (byte)local_3c;
    }
    else {
      if ((char)local_4c != '\0') {
        pIVar4 = *(pointer *)
                  ((long)&(pIVar10->dbg_line_insts_).
                          super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  + 8);
        for (pIVar13 = (pIVar10->dbg_line_insts_).
                       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                       ._M_impl.super__Vector_impl_data._M_start; pIVar13 != pIVar4;
            pIVar13 = pIVar13 + 1) {
          local_58._M_head_impl = pIVar13;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021610f;
          bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
          if (!bVar6) {
            return false;
          }
        }
      }
      local_58._M_head_impl = pIVar10;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0021610f:
        std::__throw_bad_function_call();
      }
      bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
      bVar5 = (byte)local_3c & bVar6;
    }
    if (bVar5 != 0) {
      pFVar11 = (Function *)
                (local_48->non_semantic_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_48 = (Function *)
                 (local_48->non_semantic_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pFVar11 == local_48) {
        bVar6 = true;
      }
      else {
        do {
          _Var1._M_head_impl =
               (pFVar11->def_inst_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          if ((char)local_4c != '\0') {
            pIVar13 = *(pointer *)((long)&(_Var1._M_head_impl)->dbg_line_insts_ + 8);
            for (pIVar10 = *(Instruction **)
                            &((_Var1._M_head_impl)->dbg_line_insts_).
                             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                ; pIVar10 != pIVar13; pIVar10 = pIVar10 + 1) {
              local_58._M_head_impl = pIVar10;
              if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021610f;
              bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
              if (!bVar6) {
                return false;
              }
            }
          }
          local_58._M_head_impl = _Var1._M_head_impl;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021610f;
          bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
        } while ((bVar6) && (pFVar11 = (Function *)&pFVar11->params_, pFVar11 != local_48));
      }
    }
  }
  else {
    do {
      if (pIVar10 == (Instruction *)0x0) goto LAB_00215fc1;
      pIVar13 = (pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar13 = (Instruction *)0x0;
      }
      if ((char)local_4c != '\0') {
        pIVar2 = (pIVar10->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pIVar8 = (pIVar10->dbg_line_insts_).
                      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                      ._M_impl.super__Vector_impl_data._M_start; pIVar8 != pIVar2;
            pIVar8 = pIVar8 + 1) {
          local_58._M_head_impl = pIVar8;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021610f;
          bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
          if (!bVar6) {
            return false;
          }
        }
      }
      local_58._M_head_impl = pIVar10;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021610f;
      bVar7 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
      bVar6 = false;
      pIVar10 = pIVar13;
    } while (bVar7);
  }
  return bVar6;
}

Assistant:

bool Function::WhileEachInst(const std::function<bool(Instruction*)>& f,
                             bool run_on_debug_line_insts,
                             bool run_on_non_semantic_insts) {
  if (def_inst_) {
    if (!def_inst_->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  for (auto& param : params_) {
    if (!param->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (!debug_insts_in_header_.empty()) {
    Instruction* di = &debug_insts_in_header_.front();
    while (di != nullptr) {
      Instruction* next_instruction = di->NextNode();
      if (!di->WhileEachInst(f, run_on_debug_line_insts)) return false;
      di = next_instruction;
    }
  }

  for (auto& bb : blocks_) {
    if (!bb->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (end_inst_) {
    if (!end_inst_->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (run_on_non_semantic_insts) {
    for (auto& non_semantic : non_semantic_) {
      if (!non_semantic->WhileEachInst(f, run_on_debug_line_insts)) {
        return false;
      }
    }
  }

  return true;
}